

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSGlue::emitMemory(Wasm2JSGlue *this)

{
  bool bVar1;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *this_00;
  size_type sVar2;
  pointer pDVar3;
  ostream *poVar4;
  type segment;
  ulong uVar5;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  reference local_88;
  value_type *seg_2;
  Wasm2JSGlue *pWStack_78;
  Index i_1;
  anon_class_8_1_8991fb9c globalOffset;
  string local_60;
  reference local_40;
  value_type *seg_1;
  reference puStack_30;
  Index i;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *seg;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *__range1;
  Wasm2JSGlue *this_local;
  
  bVar1 = needsBufferView(this->wasm);
  if (bVar1) {
    Output::operator<<(this->out,(char (*) [19])"  var bufferView;\n");
  }
  bVar1 = std::
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ::empty(&this->wasm->dataSegments);
  if (!bVar1) {
    this_00 = &this->wasm->dataSegments;
    __end1 = std::
             vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ::begin(this_00);
    seg = (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
          std::
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                                       *)&seg), bVar1) {
      puStack_30 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                   ::operator*(&__end1);
      pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(puStack_30);
      if ((pDVar3->isPassive & 1U) != 0) {
        Output::operator<<(this->out,(char (*) [28])"  var memorySegments = {};\n");
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
      ::operator++(&__end1);
    }
    Output::operator<<(this->out,
                       (char (*) [1042])
                       "  var base64ReverseLookup = new Uint8Array(123/*\'z\'+1*/);\n  for (var i = 25; i >= 0; --i) {\n    base64ReverseLookup[48+i] = 52+i; // \'0-9\'\n    base64ReverseLookup[65+i] = i; // \'A-Z\'\n    base64ReverseLookup[97+i] = 26+i; // \'a-z\'\n  }\n  base64ReverseLookup[43] = 62; // \'+\'\n  base64ReverseLookup[47] = 63; // \'/\'\n  /** @noinline Inlining this function would mean expanding the base64 string 4x times in the source code, which Closure seems to be happy to do. */\n  function base64DecodeToExistingUint8Array(uint8Array, offset, b64) {\n    var b1, b2, i = 0, j = offset, bLength = b64.length, end = offset + (bLength*3>>2) - (b64[bLength-2] == \'=\') - (b64[bLength-1] == \'=\');\n    for (; i < bLength; i += 4) {\n      b1 = base64ReverseLookup[b64.charCodeAt(i+1)];\n      b2 = base64ReverseLookup[b64.charCodeAt(i+2)];\n      uint8Array[j++] = base64ReverseLookup[b64.charCodeAt(i)] << 2 | b1 >> 4;\n      if (j < end) uint8Array[j++] = b1 << 4 | b2 >> 2;\n      if (j < end) uint8Array[j++] = b2 << 6 | base64ReverseLookup[b64.charCodeAt(i+3)];\n    }"
                      );
    bVar1 = FeatureSet::hasBulkMemory(&this->wasm->features);
    if (bVar1) {
      Output::operator<<(this->out,(char (*) [24])"\n    return uint8Array;");
    }
    Output::operator<<(this->out,(char (*) [6])"\n  }\n");
    for (seg_1._4_4_ = 0; uVar5 = (ulong)seg_1._4_4_,
        sVar2 = std::
                vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ::size(&this->wasm->dataSegments), uVar5 < sVar2; seg_1._4_4_ = seg_1._4_4_ + 1) {
      local_40 = std::
                 vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ::operator[](&this->wasm->dataSegments,(ulong)seg_1._4_4_);
      pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(local_40);
      if ((pDVar3->isPassive & 1U) != 0) {
        poVar4 = Output::operator<<(this->out,(char (*) [16])"memorySegments[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,seg_1._4_4_);
        poVar4 = std::operator<<(poVar4,"] = base64DecodeToExistingUint8Array(new Uint8Array(");
        pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->(local_40);
        sVar2 = std::vector<char,_std::allocator<char>_>::size(&pDVar3->data);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
        poVar4 = std::operator<<(poVar4,")");
        poVar4 = std::operator<<(poVar4,", 0, \"");
        pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->(local_40);
        base64Encode_abi_cxx11_(&local_60,&pDVar3->data);
        poVar4 = std::operator<<(poVar4,(string *)&local_60);
        std::operator<<(poVar4,"\");\n");
        std::__cxx11::string::~string((string *)&local_60);
      }
    }
    bVar1 = hasActiveSegments(this->wasm);
    if (bVar1) {
      pWStack_78 = this;
      Output::operator<<(this->out,(char (*) [40])"function initActiveSegments(imports) {\n");
      for (seg_2._4_4_ = 0; uVar5 = (ulong)seg_2._4_4_,
          sVar2 = std::
                  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                  ::size(&this->wasm->dataSegments), uVar5 < sVar2; seg_2._4_4_ = seg_2._4_4_ + 1) {
        local_88 = std::
                   vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ::operator[](&this->wasm->dataSegments,(ulong)seg_2._4_4_);
        pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->(local_88);
        if ((pDVar3->isPassive & 1U) == 0) {
          poVar4 = Output::operator<<(this->out,
                                      (char (*) [48])
                                      "  base64DecodeToExistingUint8Array(bufferView, ");
          segment = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                    operator*(local_88);
          emitMemory()::$_0::operator()::DataSegment_const___const
                    (&local_a8,&stack0xffffffffffffff88,segment);
          poVar4 = std::operator<<(poVar4,(string *)&local_a8);
          poVar4 = std::operator<<(poVar4,", \"");
          pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                   operator->(local_88);
          base64Encode_abi_cxx11_(&local_c8,&pDVar3->data);
          poVar4 = std::operator<<(poVar4,(string *)&local_c8);
          std::operator<<(poVar4,"\");\n");
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_a8);
        }
      }
      Output::operator<<(this->out,(char (*) [3])0x28cd83);
    }
  }
  return;
}

Assistant:

void Wasm2JSGlue::emitMemory() {
  if (needsBufferView(wasm)) {
    // Create a helper bufferView to access the buffer if we need one. We use it
    // for creating memory segments if we have any (we may not if the segments
    // are shipped in a side .mem file, for example), and also in bulk memory
    // operations.
    // This will get assigned during `asmFunc` (and potentially re-assigned
    // during __wasm_memory_grow).
    // TODO: We should probably just share a single HEAPU8 var.
    out << "  var bufferView;\n";
  }

  // If there are no memory segments, we don't need to emit any support code for
  // segment creation.
  if (wasm.dataSegments.empty()) {
    return;
  }

  // If we have passive memory segments, we need to store those.
  for (auto& seg : wasm.dataSegments) {
    if (seg->isPassive) {
      out << "  var memorySegments = {};\n";
      break;
    }
  }

  out <<
    R"(  var base64ReverseLookup = new Uint8Array(123/*'z'+1*/);
  for (var i = 25; i >= 0; --i) {
    base64ReverseLookup[48+i] = 52+i; // '0-9'
    base64ReverseLookup[65+i] = i; // 'A-Z'
    base64ReverseLookup[97+i] = 26+i; // 'a-z'
  }
  base64ReverseLookup[43] = 62; // '+'
  base64ReverseLookup[47] = 63; // '/'
  /** @noinline Inlining this function would mean expanding the base64 string 4x times in the source code, which Closure seems to be happy to do. */
  function base64DecodeToExistingUint8Array(uint8Array, offset, b64) {
    var b1, b2, i = 0, j = offset, bLength = b64.length, end = offset + (bLength*3>>2) - (b64[bLength-2] == '=') - (b64[bLength-1] == '=');
    for (; i < bLength; i += 4) {
      b1 = base64ReverseLookup[b64.charCodeAt(i+1)];
      b2 = base64ReverseLookup[b64.charCodeAt(i+2)];
      uint8Array[j++] = base64ReverseLookup[b64.charCodeAt(i)] << 2 | b1 >> 4;
      if (j < end) uint8Array[j++] = b1 << 4 | b2 >> 2;
      if (j < end) uint8Array[j++] = b2 << 6 | base64ReverseLookup[b64.charCodeAt(i+3)];
    })";
  if (wasm.features.hasBulkMemory()) {
    // Passive segments in bulk memory are initialized into new arrays that are
    // passed into here, and we need to return them.
    out << R"(
    return uint8Array;)";
  }
  out << R"(
  }
)";

  for (Index i = 0; i < wasm.dataSegments.size(); i++) {
    auto& seg = wasm.dataSegments[i];
    if (seg->isPassive) {
      // Fancy passive segments are decoded into typed arrays on the side, for
      // later copying.
      out << "memorySegments[" << i
          << "] = base64DecodeToExistingUint8Array(new Uint8Array("
          << seg->data.size() << ")"
          << ", 0, \"" << base64Encode(seg->data) << "\");\n";
    }
  }

  if (hasActiveSegments(wasm)) {
    auto globalOffset = [&](const DataSegment& segment) {
      if (auto* c = segment.offset->dynCast<Const>()) {
        return std::to_string(c->value.getInteger());
      }
      if (auto* get = segment.offset->dynCast<GlobalGet>()) {
        auto internalName = get->name;
        auto importedGlobal = wasm.getGlobal(internalName);
        return std::string("imports['") + importedGlobal->module.toString() +
               "']['" + importedGlobal->base.toString() + "']";
      }
      Fatal() << "non-constant offsets aren't supported yet\n";
    };

    out << "function initActiveSegments(imports) {\n";
    for (Index i = 0; i < wasm.dataSegments.size(); i++) {
      auto& seg = wasm.dataSegments[i];
      if (!seg->isPassive) {
        // Plain active segments are decoded directly into the main memory.
        out << "  base64DecodeToExistingUint8Array(bufferView, "
            << globalOffset(*seg) << ", \"" << base64Encode(seg->data)
            << "\");\n";
      }
    }
    out << "}\n";
  }
}